

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

void __thiscall wabt::WastLexer::ReadSign(WastLexer *this)

{
  char *pcVar1;
  
  pcVar1 = this->cursor_;
  if ((pcVar1 < this->buffer_end_) && ((*pcVar1 == '-' || (*pcVar1 == '+')))) {
    this->cursor_ = pcVar1 + 1;
  }
  return;
}

Assistant:

int WastLexer::PeekChar() {
  return cursor_ < buffer_end_ ? static_cast<uint8_t>(*cursor_) : kEof;
}